

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::ASL_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  
  this->cycles = 7;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 2;
  uVar4 = (uint)(byte)((char)uVar2 + this->X);
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar4);
  this->cycles = this->cycles - 1;
  bVar1 = (byte)iVar3 * '\x02';
  (this->field_6).ps =
       bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7c | (byte)iVar3 >> 7;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar4,(ulong)bVar1);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::ASL_AB_X()
{
    cycles = 7;
    uint8_t addr = GetWord() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    C = (data & 0b10000000) > 0;
    data <<= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}